

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dzsum1.c
# Opt level: O3

double dzsum1_slu(int *n,doublecomplex *cx,int *incx)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  
  dVar5 = 0.0;
  if (0 < *n) {
    iVar4 = *incx;
    if (iVar4 == 1) {
      lVar3 = 0;
      do {
        dVar6 = z_abs(cx);
        dVar5 = dVar5 + dVar6;
        lVar3 = lVar3 + 1;
        cx = cx + 1;
      } while (lVar3 < *n);
    }
    else {
      iVar2 = *n * iVar4;
      bVar1 = 0 < iVar2;
      if (iVar4 < 0) {
        bVar1 = iVar2 < 2;
      }
      if (bVar1) {
        iVar4 = 1;
        do {
          dVar6 = z_abs(cx + (long)iVar4 + -1);
          dVar5 = dVar5 + dVar6;
          iVar4 = iVar4 + *incx;
          bVar1 = iVar4 <= iVar2;
          if (*incx < 0) {
            bVar1 = iVar2 <= iVar4;
          }
        } while (bVar1);
      }
    }
  }
  return dVar5;
}

Assistant:

double dzsum1_slu(int *n, doublecomplex *cx, int *incx)
{

    /* Builtin functions */
    double z_abs(doublecomplex *);
    
    /* Local variables */
    int i, nincx;
    double stemp;


#define CX(I) cx[(I)-1]

    stemp = 0.;
    if (*n <= 0) {
	return stemp;
    }
    if (*incx == 1) {
	goto L20;
    }

    /*     CODE FOR INCREMENT NOT EQUAL TO 1 */

    nincx = *n * *incx;
    for (i = 1; *incx < 0 ? i >= nincx : i <= nincx; i += *incx) {

	/*        NEXT LINE MODIFIED. */

	stemp += z_abs(&CX(i));
/* L10: */
    }
    
    return stemp;

    /*     CODE FOR INCREMENT EQUAL TO 1 */

L20:
    for (i = 1; i <= *n; ++i) {

	/*        NEXT LINE MODIFIED. */

	stemp += z_abs(&CX(i));
/* L30: */
    }
    
    return stemp;

    /*     End of DZSUM1 */

}